

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

void __thiscall
OpenMesh::PolyConnectivity::delete_face
          (PolyConnectivity *this,FaceHandle _fh,bool _delete_isolated_vertices)

{
  bool bVar1;
  StatusInfo *pSVar2;
  reference pEVar3;
  reference pVVar4;
  byte local_185;
  __normal_iterator<OpenMesh::VertexHandle_*,_std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>
  local_180;
  iterator v_end;
  iterator v_it;
  BaseHandle local_158;
  BaseHandle local_154;
  BaseHandle local_150;
  int local_14c;
  BaseHandle local_148;
  BaseHandle local_144;
  BaseHandle local_140;
  BaseHandle local_13c;
  BaseHandle local_138;
  BaseHandle local_134;
  BaseHandle local_130;
  BaseHandle local_12c;
  BaseHandle local_128;
  BaseHandle local_124;
  BaseHandle local_120;
  BaseHandle local_11c;
  BaseHandle local_118;
  BaseHandle local_114;
  BaseHandle local_110;
  BaseHandle local_10c;
  BaseHandle local_108;
  BaseHandle local_104;
  BaseHandle local_100;
  BaseHandle local_fc;
  BaseHandle local_f8;
  BaseHandle local_f4;
  BaseHandle local_f0;
  BaseHandle local_ec;
  BaseHandle local_e8;
  BaseHandle local_e4;
  BaseHandle local_e0;
  BaseHandle local_dc;
  VertexHandle v1;
  VertexHandle v0;
  HalfedgeHandle prev1;
  HalfedgeHandle prev0;
  HalfedgeHandle next1;
  HalfedgeHandle next0;
  HalfedgeHandle h1;
  HalfedgeHandle h0;
  iterator del_end;
  iterator del_it;
  BaseHandle local_a8 [2];
  BaseHandle local_a0 [2];
  BaseHandle local_98;
  BaseHandle local_94;
  BaseHandle local_90;
  BaseHandle local_8c;
  undefined1 local_88 [8];
  FaceHalfedgeIter fh_it;
  undefined1 local_68 [4];
  HalfedgeHandle hh;
  vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> vhandles;
  undefined1 local_40 [8];
  vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> deleted_edges;
  bool _delete_isolated_vertices_local;
  PolyConnectivity *this_local;
  FaceHandle _fh_local;
  
  this_local._4_4_ = _fh.super_BaseHandle.idx_;
  bVar1 = BaseHandle::is_valid((BaseHandle *)((long)&this_local + 4));
  local_185 = 0;
  if (bVar1) {
    pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,(FaceHandle)this_local._4_4_);
    bVar1 = Attributes::StatusInfo::deleted(pSVar2);
    local_185 = bVar1 ^ 0xff;
  }
  if ((local_185 & 1) != 0) {
    deleted_edges.super__Vector_base<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = this_local._4_4_;
    pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,(FaceHandle)this_local._4_4_);
    Attributes::StatusInfo::set_deleted(pSVar2,true);
    std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>::vector
              ((vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> *)local_40);
    std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>::reserve
              ((vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> *)local_40,3);
    std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::vector
              ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_68);
    std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::reserve
              ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_68,3
              );
    HalfedgeHandle::HalfedgeHandle
              ((HalfedgeHandle *)
               &fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.field_0x14,-1);
    local_8c.idx_ = this_local._4_4_;
    fh_iter((FaceHalfedgeIter *)local_88,this,(FaceHandle)this_local._4_4_);
    while (bVar1 = Iterators::
                   GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                   ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                               *)local_88), bVar1) {
      local_94.idx_ =
           (int)Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                             *)local_88);
      local_90.idx_ = local_94.idx_;
      fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = local_94.idx_;
      ArrayKernel::set_boundary(&this->super_ArrayKernel,(HalfedgeHandle)local_94.idx_);
      local_a0[1].idx_ = fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_;
      local_98.idx_ =
           (int)ArrayKernel::opposite_halfedge_handle
                          (&this->super_ArrayKernel,
                           (HalfedgeHandle)
                           fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_);
      bVar1 = is_boundary(this,(HalfedgeHandle)local_98.idx_);
      if (bVar1) {
        local_a8[1].idx_ = fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_;
        local_a0[0].idx_ =
             (int)ArrayKernel::edge_handle
                            (&this->super_ArrayKernel,
                             (HalfedgeHandle)
                             fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_);
        std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>::push_back
                  ((vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> *)local_40,
                   (value_type *)local_a0);
      }
      local_a8[0].idx_ =
           (int)ArrayKernel::to_vertex_handle
                          (&this->super_ArrayKernel,
                           (HalfedgeHandle)
                           fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_);
      std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::push_back
                ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_68
                 ,(value_type *)local_a8);
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_88);
    }
    bVar1 = std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>::empty
                      ((vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> *)
                       local_40);
    if (!bVar1) {
      del_end = std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>::begin
                          ((vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> *)
                           local_40);
      _h1 = std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>::end
                      ((vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> *)
                       local_40);
      HalfedgeHandle::HalfedgeHandle(&next0,-1);
      HalfedgeHandle::HalfedgeHandle(&next1,-1);
      HalfedgeHandle::HalfedgeHandle(&prev0,-1);
      HalfedgeHandle::HalfedgeHandle(&prev1,-1);
      HalfedgeHandle::HalfedgeHandle((HalfedgeHandle *)&v0,-1);
      HalfedgeHandle::HalfedgeHandle((HalfedgeHandle *)&v1,-1);
      VertexHandle::VertexHandle((VertexHandle *)&local_dc,-1);
      VertexHandle::VertexHandle((VertexHandle *)&local_e0,-1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&del_end,(__normal_iterator<OpenMesh::EdgeHandle_*,_std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>_>
                                          *)&h1), bVar1) {
        pEVar3 = __gnu_cxx::
                 __normal_iterator<OpenMesh::EdgeHandle_*,_std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>_>
                 ::operator*(&del_end);
        local_e8.idx_ = (pEVar3->super_BaseHandle).idx_;
        local_f0.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,local_e8.idx_,0);
        local_e4.idx_ = local_f0.idx_;
        next0.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_f0.idx_;
        local_ec.idx_ =
             (int)ArrayKernel::to_vertex_handle
                            (&this->super_ArrayKernel,(HalfedgeHandle)local_f0.idx_);
        local_f8 = next0.super_BaseHandle.idx_;
        local_dc.idx_ = local_ec.idx_;
        local_f4.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,next0);
        local_100 = next0.super_BaseHandle.idx_;
        prev0.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_f4.idx_;
        local_fc.idx_ = (int)ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,next0);
        v0.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_fc.idx_;
        pEVar3 = __gnu_cxx::
                 __normal_iterator<OpenMesh::EdgeHandle_*,_std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>_>
                 ::operator*(&del_end);
        local_108.idx_ = (pEVar3->super_BaseHandle).idx_;
        local_110.idx_ =
             (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,local_108.idx_,1);
        local_104.idx_ = local_110.idx_;
        next1.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_110.idx_;
        local_10c.idx_ =
             (int)ArrayKernel::to_vertex_handle
                            (&this->super_ArrayKernel,(HalfedgeHandle)local_110.idx_);
        local_118 = next1.super_BaseHandle.idx_;
        local_e0.idx_ = local_10c.idx_;
        local_114.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,next1);
        local_120 = next1.super_BaseHandle.idx_;
        prev1.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_114.idx_;
        local_11c.idx_ = (int)ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,next1);
        local_124 = v0.super_BaseHandle.idx_;
        local_128 = prev1.super_BaseHandle.idx_;
        v1.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_11c.idx_;
        ArrayKernel::set_next_halfedge_handle
                  (&this->super_ArrayKernel,(HalfedgeHandle)v0.super_BaseHandle.idx_,prev1);
        local_12c = v1.super_BaseHandle.idx_;
        local_130 = prev0.super_BaseHandle.idx_;
        ArrayKernel::set_next_halfedge_handle
                  (&this->super_ArrayKernel,(HalfedgeHandle)v1.super_BaseHandle.idx_,prev0);
        bVar1 = ArrayKernel::has_edge_status(&this->super_ArrayKernel);
        if (bVar1) {
          pEVar3 = __gnu_cxx::
                   __normal_iterator<OpenMesh::EdgeHandle_*,_std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>_>
                   ::operator*(&del_end);
          local_134.idx_ = (pEVar3->super_BaseHandle).idx_;
          pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,(EdgeHandle)local_134.idx_);
          Attributes::StatusInfo::set_deleted(pSVar2,true);
        }
        bVar1 = ArrayKernel::has_halfedge_status(&this->super_ArrayKernel);
        if (bVar1) {
          local_138 = next0.super_BaseHandle.idx_;
          pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,next0);
          Attributes::StatusInfo::set_deleted(pSVar2,true);
          local_13c = next1.super_BaseHandle.idx_;
          pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,next1);
          Attributes::StatusInfo::set_deleted(pSVar2,true);
        }
        local_144.idx_ = local_dc.idx_;
        local_140.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,local_dc.idx_);
        bVar1 = BaseHandle::operator==(&local_140,&next1.super_BaseHandle);
        if (bVar1) {
          bVar1 = BaseHandle::operator==(&prev0.super_BaseHandle,&next1.super_BaseHandle);
          if (bVar1) {
            if (_delete_isolated_vertices) {
              local_148.idx_ = local_dc.idx_;
              pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,(VertexHandle)local_dc.idx_);
              Attributes::StatusInfo::set_deleted(pSVar2,true);
            }
            local_14c = local_dc.idx_;
            ArrayKernel::set_isolated(&this->super_ArrayKernel,(VertexHandle)local_dc.idx_);
          }
          else {
            local_150.idx_ = local_dc.idx_;
            local_154 = prev0.super_BaseHandle.idx_;
            ArrayKernel::set_halfedge_handle
                      (&this->super_ArrayKernel,(VertexHandle)local_dc.idx_,prev0);
          }
        }
        local_158.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,local_e0.idx_);
        bVar1 = BaseHandle::operator==(&local_158,&next0.super_BaseHandle);
        if (bVar1) {
          bVar1 = BaseHandle::operator==(&prev1.super_BaseHandle,&next0.super_BaseHandle);
          if (bVar1) {
            if (_delete_isolated_vertices) {
              pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,(VertexHandle)local_e0.idx_);
              Attributes::StatusInfo::set_deleted(pSVar2,true);
            }
            ArrayKernel::set_isolated(&this->super_ArrayKernel,(VertexHandle)local_e0.idx_);
          }
          else {
            ArrayKernel::set_halfedge_handle
                      (&this->super_ArrayKernel,(VertexHandle)local_e0.idx_,prev1);
          }
        }
        __gnu_cxx::
        __normal_iterator<OpenMesh::EdgeHandle_*,_std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>_>
        ::operator++(&del_end);
      }
    }
    v_end = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::begin
                      ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                       local_68);
    local_180._M_current =
         (VertexHandle *)
         std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::end
                   ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                    local_68);
    while (bVar1 = __gnu_cxx::operator!=(&v_end,&local_180), bVar1) {
      pVVar4 = __gnu_cxx::
               __normal_iterator<OpenMesh::VertexHandle_*,_std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>
               ::operator*(&v_end);
      adjust_outgoing_halfedge(this,(VertexHandle)(pVVar4->super_BaseHandle).idx_);
      __gnu_cxx::
      __normal_iterator<OpenMesh::VertexHandle_*,_std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>
      ::operator++(&v_end);
    }
    std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::~vector
              ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_68);
    std::vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_>::~vector
              ((vector<OpenMesh::EdgeHandle,_std::allocator<OpenMesh::EdgeHandle>_> *)local_40);
    return;
  }
  __assert_fail("_fh.is_valid() && !status(_fh).deleted()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                ,0x1f8,"void OpenMesh::PolyConnectivity::delete_face(FaceHandle, bool)");
}

Assistant:

void PolyConnectivity::delete_face(FaceHandle _fh, bool _delete_isolated_vertices)
{
  assert(_fh.is_valid() && !status(_fh).deleted());

  // mark face deleted
  status(_fh).set_deleted(true);


  // this vector will hold all boundary edges of face _fh
  // these edges will be deleted
  std::vector<EdgeHandle> deleted_edges;
  deleted_edges.reserve(3);


  // this vector will hold all vertices of face _fh
  // for updating their outgoing halfedge
  std::vector<VertexHandle>  vhandles;
  vhandles.reserve(3);


  // for all halfedges of face _fh do:
  //   1) invalidate face handle.
  //   2) collect all boundary halfedges, set them deleted
  //   3) store vertex handles
  HalfedgeHandle hh;
  for (FaceHalfedgeIter fh_it(fh_iter(_fh)); fh_it.is_valid(); ++fh_it)
  {
    hh = *fh_it;

    set_boundary(hh);//set_face_handle(hh, InvalidFaceHandle);

    if (is_boundary(opposite_halfedge_handle(hh)))
        deleted_edges.push_back(edge_handle(hh));

    vhandles.push_back(to_vertex_handle(hh));
  }


  // delete all collected (half)edges
  // these edges were all boundary
  // delete isolated vertices (if _delete_isolated_vertices is true)
  if (!deleted_edges.empty())
  {
    std::vector<EdgeHandle>::iterator del_it(deleted_edges.begin()),
                                      del_end(deleted_edges.end());
    HalfedgeHandle h0, h1, next0, next1, prev0, prev1;
    VertexHandle   v0, v1;

    for (; del_it!=del_end; ++del_it)
    {
      h0    = halfedge_handle(*del_it, 0);
      v0    = to_vertex_handle(h0);
      next0 = next_halfedge_handle(h0);
      prev0 = prev_halfedge_handle(h0);

      h1    = halfedge_handle(*del_it, 1);
      v1    = to_vertex_handle(h1);
      next1 = next_halfedge_handle(h1);
      prev1 = prev_halfedge_handle(h1);

      // adjust next and prev handles
      set_next_halfedge_handle(prev0, next1);
      set_next_halfedge_handle(prev1, next0);

      // mark edge deleted if the mesh has a edge status
      if ( has_edge_status() )
    	 status(*del_it).set_deleted(true);


      // mark corresponding halfedges as deleted
      // As the deleted edge is boundary,
      // all corresponding halfedges will also be deleted.
      if ( has_halfedge_status() ) {
        status(h0).set_deleted(true);
        status(h1).set_deleted(true);
      }

      // update v0
      if (halfedge_handle(v0) == h1)
      {
        // isolated ?
        if (next0 == h1)
        {
          if (_delete_isolated_vertices)
            status(v0).set_deleted(true);
          set_isolated(v0);
        }
        else set_halfedge_handle(v0, next0);
      }

      // update v1
      if (halfedge_handle(v1) == h0)
      {
        // isolated ?
        if (next1 == h0)
        {
          if (_delete_isolated_vertices)
            status(v1).set_deleted(true);
          set_isolated(v1);
        }
        else  set_halfedge_handle(v1, next1);
      }
    }
  }

  // update outgoing halfedge handles of remaining vertices
  std::vector<VertexHandle>::iterator v_it(vhandles.begin()),
                                      v_end(vhandles.end());
  for (; v_it!=v_end; ++v_it)
    adjust_outgoing_halfedge(*v_it);
}